

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

NULLCRef * NULLCVector::VectorBack(NULLCRef *__return_storage_ptr__,vector *vec)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  uVar2 = vec->size;
  if (uVar2 == 0) {
    nullcThrowError("vector::back called on an empty vector");
    return __return_storage_ptr__;
  }
  if (vec->flags == 0) {
    __return_storage_ptr__->typeID = vec->elemType;
  }
  else {
    uVar2 = nullcGetSubType(0);
    uVar1 = vec->flags;
    __return_storage_ptr__->typeID = uVar2;
    uVar2 = vec->size;
    if (uVar1 != 0) {
      pcVar3 = *(char **)((vec->data).ptr + (ulong)(uVar2 - 1) * 8);
      goto LAB_0012ba60;
    }
  }
  pcVar3 = (vec->data).ptr + (uVar2 - 1) * vec->elemSize;
LAB_0012ba60:
  __return_storage_ptr__->ptr = pcVar3;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorBack(vector* vec)
	{
		NULLCRef ret = { 0, 0 };
		if(!vec->size)
		{
			nullcThrowError("vector::back called on an empty vector");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? ((char**)vec->data.ptr)[vec->size - 1] : (vec->data.ptr + vec->elemSize * (vec->size - 1));
		return ret;
	}